

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord_r.hh
# Opt level: O1

void avro::codec_traits<testgen_r::_bigrecord_r_Union__0__>::decode
               (Decoder *d,_bigrecord_r_Union__0__ *v)

{
  placeholder *ppVar1;
  undefined4 uVar2;
  placeholder *tmp;
  ulong uVar3;
  placeholder *ppVar4;
  undefined8 *puVar5;
  string vv;
  string local_40;
  
  uVar3 = (**(code **)(*(long *)d + 0xb0))();
  if (1 < uVar3) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Union index too big","");
    std::runtime_error::runtime_error((runtime_error *)(puVar5 + 1),(string *)&local_40);
    *puVar5 = 0x1c87a0;
    puVar5[1] = 0x1c87d0;
    __cxa_throw(puVar5,&Exception::typeinfo,Exception::~Exception);
  }
  if ((uVar3 & 1) == 0) {
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    decode(d,&local_40);
    v->idx_ = 0;
    boost::any::operator=(&v->value_,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    uVar2 = (**(code **)(*(long *)d + 0x28))(d);
    v->idx_ = 1;
    ppVar4 = (placeholder *)operator_new(0x10);
    ppVar4->_vptr_placeholder = (_func_int **)&PTR__placeholder_001c8aa8;
    *(undefined4 *)&ppVar4[1]._vptr_placeholder = uVar2;
    ppVar1 = (v->value_).content;
    (v->value_).content = ppVar4;
    if (ppVar1 != (placeholder *)0x0) {
      (*ppVar1->_vptr_placeholder[1])();
      return;
    }
  }
  return;
}

Assistant:

static void decode(Decoder& d, testgen_r::_bigrecord_r_Union__0__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            {
                std::string vv;
                avro::decode(d, vv);
                v.set_string(vv);
            }
            break;
        case 1:
            {
                int32_t vv;
                avro::decode(d, vv);
                v.set_int(vv);
            }
            break;
        }
    }